

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O1

int CompareToUpperCaseString(uint8_t *tld,size_t length,char *target)

{
  byte bVar1;
  uint uVar2;
  size_t sVar3;
  
  sVar3 = 0;
  if (length == 0) {
    uVar2 = 0;
  }
  else {
    do {
      bVar1 = target[sVar3];
      if (bVar1 == 0) {
        uVar2 = 1;
        goto LAB_0015f436;
      }
      if (bVar1 != tld[sVar3]) {
        uVar2 = -(uint)(tld[sVar3] < bVar1) | 1;
        goto LAB_0015f436;
      }
      sVar3 = sVar3 + 1;
    } while (length != sVar3);
    uVar2 = 0;
    sVar3 = length;
  }
LAB_0015f436:
  if ((uVar2 == 0) && (uVar2 = 0, sVar3 == length)) {
    return -(uint)(target[sVar3] != '\0');
  }
  return uVar2;
}

Assistant:

static int CompareToUpperCaseString(const uint8_t * tld, size_t length, const char * target)
{
    int ret = 0;
    size_t j = 0;
    uint8_t * x = (uint8_t *)target;

    for (; j < length; j++)
    {
        if (x[j] == 0)
        {
            ret = 1; /* Target string is longer, thus larger */
            break;
        }
        else if (x[j] != tld[j]) {
            ret = (tld[j] < x[j]) ? -1 : 1;
            break;
        }
    }

    if (ret == 0 && j == length && x[j] != 0)
    {
        ret = -1; /* Target string is shorter, thus lower */
    }

    return ret;
}